

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Spc_Emu::load_mem_(Spc_Emu *this,byte_ *in,long size)

{
  blargg_err_t pcVar1;
  
  this->file_data = in;
  this->file_size = size;
  (this->super_Music_Emu).voice_count_ = 8;
  if (size < 0x10180) {
    return "Wrong file type for this emulator";
  }
  pcVar1 = check_spc_header(in);
  return pcVar1;
}

Assistant:

blargg_err_t Spc_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,unused2 [46]) == header_size );
	file_data = in;
	file_size = size;
	set_voice_count( Snes_Spc::voice_count );
	if ( size < Snes_Spc::spc_min_file_size )
		return gme_wrong_file_type;
	return check_spc_header( in );
}